

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptconfig.c
# Opt level: O3

int poptReadConfigFile(poptContext con,char *fn)

{
  size_t sVar1;
  char **ppcVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  byte *__ptr;
  ushort **ppuVar6;
  size_t sVar7;
  char *pcVar8;
  byte *pbVar9;
  byte bVar10;
  byte *__s1;
  byte *pbVar11;
  byte *__ptr_00;
  byte bVar12;
  byte *pbVar13;
  byte *pbVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  byte *pbVar18;
  ulong uVar19;
  byte *pbVar20;
  byte *__pattern;
  size_t nb_1;
  char *b_1;
  char *b;
  size_t nb;
  size_t local_c8;
  byte *local_c0;
  byte *local_b8;
  ulong local_b0;
  poptContext local_a8;
  byte *local_a0;
  poptItem_s local_98;
  byte *local_50;
  byte *local_48;
  byte *local_40;
  size_t local_38;
  
  local_a0 = (byte *)0x0;
  local_38 = 0;
  iVar3 = poptReadFile(fn,(char **)&local_a0,&local_38,1);
  sVar1 = local_38;
  __ptr_00 = local_a0;
  if (iVar3 != 0) {
    piVar5 = __errno_location();
    if (*piVar5 != 2) {
      return iVar3;
    }
    return 0;
  }
  if (local_38 != 0 && local_a0 != (byte *)0x0) {
    __ptr = (byte *)malloc(local_38 + 1);
    if ((__ptr != (byte *)0x0) && (0 < (long)sVar1)) {
      pbVar13 = __ptr_00 + sVar1;
      local_40 = __ptr + 2;
      local_48 = __ptr + 4;
      local_50 = __ptr + 3;
      __pattern = __ptr;
      local_b8 = pbVar13;
      local_a8 = con;
LAB_001056ff:
      bVar10 = *__ptr_00;
      if (bVar10 == 0x5c) {
        __ptr_00 = __ptr_00 + 1;
        *__pattern = 0x5c;
        if ((__ptr_00 < pbVar13) && (*__ptr_00 != 10)) {
          __pattern[1] = *__ptr_00;
          __pattern = __pattern + 2;
        }
      }
      else if (bVar10 == 10) {
        *__pattern = 0;
        bVar10 = *__ptr;
        __pattern = __ptr;
        if (bVar10 != 0) {
          ppuVar6 = __ctype_b_loc();
          pbVar14 = local_40;
          pbVar18 = local_48;
          pbVar20 = local_50;
          do {
            pbVar13 = local_b8;
            if ((*(byte *)((long)*ppuVar6 + (ulong)bVar10 * 2 + 1) & 0x20) == 0) {
              if (bVar10 != 0x23) {
                local_c0 = (byte *)0x0;
                local_c8 = 0;
                pcVar8 = local_a8->appName;
                if (pcVar8 == (char *)0x0) goto LAB_00105867;
                local_98.argc = 0;
                local_98._52_4_ = 0;
                local_98.argv = (char **)0x0;
                local_98.option.descrip = (char *)0x0;
                local_98.option.argDescrip = (char *)0x0;
                local_98.option.arg = (void *)0x0;
                local_98.option.val = 0;
                local_98.option._28_4_ = 0;
                local_98.option.longName = (char *)0x0;
                local_98.option.shortName = '\0';
                local_98.option._9_3_ = 0;
                local_98.option.argInfo = 0;
                __s1 = __pattern;
                goto LAB_001057f5;
              }
              break;
            }
            bVar10 = __pattern[1];
            __pattern = __pattern + 1;
            pbVar14 = pbVar14 + 1;
            pbVar18 = pbVar18 + 1;
            pbVar20 = pbVar20 + 1;
          } while (bVar10 != 0);
        }
      }
      else {
        *__pattern = bVar10;
        __pattern = __pattern + 1;
      }
      goto LAB_0010587e;
    }
    free(__ptr);
    iVar3 = 0;
    goto LAB_00105c11;
  }
  iVar3 = -0x16;
  __ptr = (byte *)0x0;
LAB_00105c07:
  __ptr_00 = local_a0;
  free(__ptr);
  if (__ptr_00 == (byte *)0x0) {
    return iVar3;
  }
LAB_00105c11:
  free(__ptr_00);
  return iVar3;
  while( true ) {
    bVar10 = __s1[1];
    __s1 = __s1 + 1;
    pbVar14 = pbVar14 + 1;
    pbVar18 = pbVar18 + 1;
    pbVar20 = pbVar20 + 1;
    if (bVar10 == 0) break;
LAB_001057f5:
    if ((*(byte *)((long)*ppuVar6 + (ulong)bVar10 * 2 + 1) & 0x20) != 0) {
      *__s1 = 0;
      iVar3 = glob_pattern_p((char *)__pattern,1);
      if (iVar3 == 0) {
        iVar3 = strcmp((char *)__pattern,pcVar8);
      }
      else {
        iVar3 = fnmatch((char *)__pattern,pcVar8,5);
      }
      if (iVar3 == 0) goto LAB_0010588f;
      break;
    }
  }
  goto LAB_00105867;
  while( true ) {
    __s1 = __s1 + 1;
    pbVar14 = pbVar11 + 1;
    pbVar18 = pbVar13 + 1;
    pbVar20 = pbVar9 + 1;
    if ((*(byte *)((long)*ppuVar6 + uVar15 * 2 + 1) & 0x20) == 0) break;
LAB_0010588f:
    pbVar9 = pbVar20;
    pbVar13 = pbVar18;
    pbVar11 = pbVar14;
    uVar15 = (ulong)__s1[1];
    if (uVar15 == 0) goto LAB_00105867;
  }
  do {
    if ((*(byte *)((long)*ppuVar6 + uVar15 * 2 + 1) & 0x20) != 0) {
      pbVar11[-1] = 0;
      bVar10 = *pbVar11;
      if (bVar10 != 0) {
        goto LAB_001058e5;
      }
      break;
    }
    bVar10 = *pbVar11;
    uVar15 = (ulong)bVar10;
    pbVar11 = pbVar11 + 1;
    pbVar13 = pbVar13 + 1;
    pbVar9 = pbVar9 + 1;
  } while (bVar10 != 0);
  goto LAB_00105867;
  while( true ) {
    bVar10 = pbVar13[-1];
    pbVar13 = pbVar13 + 1;
    pbVar9 = pbVar9 + 1;
    if (bVar10 == 0) break;
LAB_001058e5:
    if ((*(byte *)((long)*ppuVar6 + (ulong)bVar10 * 2 + 1) & 0x20) == 0) {
      pbVar14 = pbVar13 + -2;
      bVar12 = bVar10;
      goto LAB_0010590a;
    }
  }
  goto LAB_00105867;
  while( true ) {
    bVar12 = *pbVar18;
    pbVar9 = pbVar18 + 1;
    if (bVar12 == 0) break;
LAB_0010590a:
    pbVar18 = pbVar9;
    if ((*(byte *)((long)*ppuVar6 + (ulong)bVar12 * 2 + 1) & 0x20) != 0) {
      pbVar18[-1] = 0;
      bVar10 = *pbVar18;
      if (bVar10 == 0) goto LAB_00105955;
      goto LAB_00105940;
    }
  }
  if (bVar10 != 0x2d) goto LAB_00105955;
  goto LAB_00105867;
  while( true ) {
    bVar10 = pbVar18[1];
    pbVar18 = pbVar18 + 1;
    if (bVar10 == 0) break;
LAB_00105940:
    if ((*(byte *)((long)*ppuVar6 + (ulong)bVar10 * 2 + 1) & 0x20) == 0) {
      if (*pbVar14 != 0x2d) goto LAB_00105988;
      if (pbVar13[-1] == 0x2d) goto LAB_00105a6f;
      if (*pbVar13 != 0) goto LAB_00105988;
      local_98.option.shortName = pbVar13[-1];
      pbVar13 = (byte *)local_98.option.longName;
      goto LAB_00105a6f;
    }
  }
LAB_00105955:
  if (*pbVar14 != 0x2d) {
LAB_00105988:
    iVar3 = poptReadFile((char *)pbVar14,(char **)&local_c0,&local_c8,1);
    pbVar13 = local_c0;
    sVar1 = local_c8;
    if ((iVar3 == 0) && (local_c8 != 0 && local_c0 != (byte *)0x0)) {
      pbVar20 = local_c0;
      if (*pbVar18 != 0) {
        sVar7 = strlen((char *)pbVar18);
        pbVar20 = (byte *)realloc(pbVar13,sVar7 + sVar1 + 1);
        sVar1 = local_c8;
        pbVar13 = local_b8;
        local_c0 = pbVar20;
        if (pbVar20 == (byte *)0x0) goto LAB_0010587e;
        (pbVar20 + (local_c8 - 1))[0] = 0x20;
        (pbVar20 + (local_c8 - 1))[1] = 0;
        strcpy((char *)(pbVar20 + local_c8),(char *)pbVar18);
        local_c8 = sVar7 + 1 + sVar1;
      }
      pbVar18 = pbVar20;
      pcVar8 = strrchr((char *)pbVar14,0x2f);
      pbVar13 = (byte *)(pcVar8 + 1);
      if (pcVar8 == (char *)0x0) {
        pbVar13 = pbVar14;
      }
      if (pbVar13[1] == 0) {
        local_98.option.shortName = *pbVar13;
        pbVar13 = (byte *)local_98.option.longName;
      }
LAB_00105a6f:
      local_98.option.longName = (char *)pbVar13;
      iVar3 = poptParseArgvString((char *)pbVar18,&local_98.argc,&local_98.argv);
      if (iVar3 == 0) {
        local_98.option.argInfo = 0x40000000;
        local_b0 = (ulong)local_98.argc;
        if (0 < (long)local_b0) {
          uVar4 = 0;
          uVar15 = 0;
          uVar19 = 0;
          do {
            ppcVar2 = local_98.argv;
            pcVar8 = local_98.argv[uVar15];
            iVar3 = strncmp(pcVar8,"--POPTdesc=",0xb);
            iVar16 = (int)uVar19;
            if (iVar3 == 0) {
              local_98.option.descrip = pcVar8 + 0xc;
              if ((pcVar8[0xc] == '$') && (pcVar8[0xd] == '\"')) {
                local_98.option.descrip = pcVar8 + 0xd;
              }
              uVar4 = uVar4 & 0xbfffffff;
LAB_00105b64:
              local_98.option.argInfo = uVar4;
              iVar16 = iVar16 + -1;
            }
            else {
              iVar3 = strncmp(pcVar8,"--POPTargs=",0xb);
              if (iVar3 == 0) {
                local_98.option.argDescrip = pcVar8 + 0xc;
                if ((pcVar8[0xc] == '$') && (pcVar8[0xd] == '\"')) {
                  local_98.option.argDescrip = pcVar8 + 0xd;
                }
                uVar4 = (uVar4 & 0xbffffffe) + 1;
                goto LAB_00105b64;
              }
              if (uVar15 != uVar19) {
                ppcVar2[iVar16] = pcVar8;
              }
            }
            uVar15 = uVar15 + 1;
            uVar17 = iVar16 + 1;
            uVar19 = (ulong)uVar17;
          } while (local_b0 != uVar15);
          if (uVar17 != (uint)local_b0) {
            local_98.argv[(int)uVar17] = (char *)0x0;
            local_98.argc = uVar17;
          }
        }
        iVar3 = strcmp((char *)__s1,"alias");
        if (iVar3 == 0) {
          iVar3 = 0;
        }
        else {
          iVar3 = strcmp((char *)__s1,"exec");
          if (iVar3 != 0) goto LAB_00105867;
          iVar3 = 1;
        }
        poptAddItem(local_a8,&local_98,iVar3);
      }
    }
  }
LAB_00105867:
  pbVar13 = local_b8;
  if (local_c0 != (byte *)0x0) {
    free(local_c0);
    pbVar13 = local_b8;
  }
LAB_0010587e:
  __ptr_00 = __ptr_00 + 1;
  if (pbVar13 <= __ptr_00) goto LAB_00105c00;
  goto LAB_001056ff;
LAB_00105c00:
  iVar3 = 0;
  goto LAB_00105c07;
}

Assistant:

int poptReadConfigFile(poptContext con, const char * fn)
{
    char * b = NULL, *be;
    size_t nb = 0;
    const char *se;
    char *t = NULL, *te;
    int rc;

    if ((rc = poptReadFile(fn, &b, &nb, POPT_READFILE_TRIMNEWLINES)) != 0)
	return (errno == ENOENT ? 0 : rc);
    if (b == NULL || nb == 0) {
	rc = POPT_ERROR_BADCONFIG;
	goto exit;
    }

    if ((t = malloc(nb + 1)) == NULL)
	goto exit;
    te = t;

    be = (b + nb);
    for (se = b; se < be; se++) {
	switch (*se) {
	  case '\n':
	    *te = '\0';
	    te = t;
	    while (*te && _isspaceptr(te)) te++;
	    if (*te && *te != '#')
		if ((rc = poptConfigLine(con, te)) != 0)
		    goto exit;
	    break;
	  case '\\':
	    *te = *se++;
	    /* \ at the end of a line does not insert a \n */
	    if (se < be && *se != '\n') {
		te++;
		*te++ = *se;
	    }
	    break;
	  default:
	    *te++ = *se;
	    break;
	}
    }
    rc = 0;

exit:
    free(t);
    if (b)
	free(b);
    return rc;
}